

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

ParseNodeSuperCall * __thiscall
Parser::CreateSuperCallNode(Parser *this,ParseNodeSpecialName *pnode1,ParseNodePtr pnode2)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *alloc;
  charcount_t local_84;
  TrackAllocData local_50;
  ParseNodeSuperCall *local_28;
  ParseNodeSuperCall *pnode;
  ParseNodePtr pnode2_local;
  ParseNodeSpecialName *pnode1_local;
  Parser *this_local;
  
  pnode = (ParseNodeSuperCall *)pnode2;
  pnode2_local = (ParseNodePtr)pnode1;
  pnode1_local = (ParseNodeSpecialName *)this;
  if (this->m_deferringAST != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x49f,"(!this->m_deferringAST)","!this->m_deferringAST");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((pnode2_local == (ParseNodePtr)0x0) ||
     ((*(byte *)((long)&pnode2_local[2].ichLim + 1) >> 1 & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x4a0,"(pnode1 && pnode1->isSuper)","pnode1 && pnode1->isSuper");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&ParseNodeSuperCall::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
             ,0x4a2);
  alloc = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                    ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this,
                     &local_50);
  local_28 = (ParseNodeSuperCall *)
             new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)alloc,0x3f67b0);
  if (pnode == (ParseNodeSuperCall *)0x0) {
    local_84 = pnode2_local->ichLim;
  }
  else {
    local_84 = (pnode->super_ParseNodeCall).super_ParseNode.ichLim;
  }
  ParseNodeSuperCall::ParseNodeSuperCall
            (local_28,knopCall,pnode2_local->ichMin,local_84,pnode2_local,(ParseNode *)pnode);
  AddAstSize(this,0x38);
  return local_28;
}

Assistant:

ParseNodeSuperCall * Parser::CreateSuperCallNode(ParseNodeSpecialName * pnode1, ParseNodePtr pnode2)
{
    Assert(!this->m_deferringAST);
    Assert(pnode1 && pnode1->isSuper);

    ParseNodeSuperCall* pnode = Anew(&m_nodeAllocator, ParseNodeSuperCall, knopCall, pnode1->ichMin, pnode2 == nullptr ? pnode1->ichLim : pnode2->ichLim, pnode1, pnode2);
    AddAstSize(sizeof(ParseNodeSuperCall));
    return pnode;
}